

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateBufferReferencedByShaderInterfaceBlockCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourceQueryTestTarget *queryTarget,bool extendedCases)

{
  NodeType NVar1;
  Node *pNVar2;
  Variable *pVVar3;
  ArrayElement *pAVar4;
  ResourceTestCase *pRVar5;
  LayoutQualifier *pLVar6;
  undefined1 local_260 [8];
  SharedPtr variableArray_4;
  SharedPtr structMember_4;
  SharedPtr variableArray_3;
  SharedPtr arrayElement_6;
  SharedPtr variableArrayStruct_3;
  SharedPtr subStructMember;
  SharedPtr structMember_3;
  SharedPtr variableArrayStruct_2;
  SharedPtr subArrayElement;
  SharedPtr arrayElement_5;
  SharedPtr variableArrayStruct_1;
  SharedPtr arrayStructMember;
  SharedPtr arrayElement_4;
  SharedPtr variableArrayStruct;
  SharedPtr arrayElement_3;
  SharedPtr structMember_2;
  SharedPtr variableArray_2;
  SharedPtr arrayElement_2;
  SharedPtr variable_2;
  undefined1 local_118 [8];
  SharedPtr layout_1;
  SharedPtr variableStruct_1;
  SharedPtr variableArray_1;
  SharedPtr structMember_1;
  SharedPtr arrayElement_1;
  SharedPtr variable_1;
  undefined1 local_a0 [8];
  SharedPtr layout;
  SharedPtr variableStruct;
  SharedPtr variableArray;
  SharedPtr structMember;
  SharedPtr arrayElement;
  undefined1 local_40 [8];
  SharedPtr variable;
  bool isDefaultBlock;
  bool extendedCases_local;
  ProgramResourceQueryTestTarget *queryTarget_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  variable.m_state._7_1_ = extendedCases;
  pNVar2 = de::
           SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
           ::operator->(parentStructure);
  NVar1 = ResourceDefinition::Node::getType(pNVar2);
  variable.m_state._6_1_ = NVar1 != TYPE_INTERFACE_BLOCK;
  pVVar3 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar3,parentStructure,TYPE_FLOAT);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_40,(Node *)pVVar3);
  pAVar4 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar4,parentStructure,-1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&structMember.m_state,(Node *)pAVar4);
  pNVar2 = (Node *)operator_new(0x20);
  ResourceDefinition::StructMember::StructMember((StructMember *)pNVar2,parentStructure);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&variableArray.m_state,pNVar2);
  pVVar3 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar3,(SharedPtr *)&structMember.m_state,TYPE_FLOAT);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&variableStruct.m_state,(Node *)pVVar3);
  pVVar3 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar3,(SharedPtr *)&variableArray.m_state,TYPE_FLOAT);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&layout.m_state,(Node *)pVVar3);
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ResourceTestCase::ResourceTestCase(pRVar5,context,(SharedPtr *)local_40,queryTarget,"float");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ResourceTestCase::ResourceTestCase
            (pRVar5,context,(SharedPtr *)&variableStruct.m_state,queryTarget,"float_array");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ResourceTestCase::ResourceTestCase
            (pRVar5,context,(SharedPtr *)&layout.m_state,queryTarget,"float_struct");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&layout.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&variableStruct.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&variableArray.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&structMember.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_40);
  if ((variable.m_state._6_1_ & 1) != 0) {
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)((long)&variable_1.m_state + 4),-1,0,-1,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier
              (pLVar6,parentStructure,(Layout *)((long)&variable_1.m_state + 4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_a0,(Node *)pLVar6);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,(SharedPtr *)local_a0,TYPE_SAMPLER_2D);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElement_1.m_state,(Node *)pVVar3);
    pAVar4 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar4,(SharedPtr *)local_a0,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&structMember_1.m_state,(Node *)pAVar4);
    pNVar2 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar2,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variableArray_1.m_state,pNVar2);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable
              (pVVar3,(SharedPtr *)&structMember_1.m_state,TYPE_SAMPLER_2D);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variableStruct_1.m_state,(Node *)pVVar3);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable
              (pVVar3,(SharedPtr *)&variableArray_1.m_state,TYPE_SAMPLER_2D);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&layout_1.m_state,(Node *)pVVar3);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)&arrayElement_1.m_state,queryTarget,"sampler");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)&variableStruct_1.m_state,queryTarget,"sampler_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)&layout_1.m_state,queryTarget,"sampler_struct");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&layout_1.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variableStruct_1.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variableArray_1.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&structMember_1.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElement_1.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_a0);
  }
  if ((variable.m_state._6_1_ & 1) != 0) {
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)((long)&variable_2.m_state + 4),-1,0,-1,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier
              (pLVar6,parentStructure,(Layout *)((long)&variable_2.m_state + 4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_118,(Node *)pLVar6);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,(SharedPtr *)local_118,TYPE_UINT_ATOMIC_COUNTER);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElement_2.m_state,(Node *)pVVar3);
    pAVar4 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar4,(SharedPtr *)local_118,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variableArray_2.m_state,(Node *)pAVar4);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable
              (pVVar3,(SharedPtr *)&variableArray_2.m_state,TYPE_UINT_ATOMIC_COUNTER);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&structMember_2.m_state,(Node *)pVVar3);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)&arrayElement_2.m_state,queryTarget,"atomic_uint");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)&structMember_2.m_state,queryTarget,"atomic_uint_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&structMember_2.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variableArray_2.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElement_2.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_118);
  }
  if ((variable.m_state._7_1_ & 1) != 0) {
    pNVar2 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar2,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElement_3.m_state,pNVar2);
    pAVar4 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar4,(SharedPtr *)&arrayElement_3.m_state,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variableArrayStruct.m_state,(Node *)pAVar4);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable
              (pVVar3,(SharedPtr *)&variableArrayStruct.m_state,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElement_4.m_state,(Node *)pVVar3);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)&arrayElement_4.m_state,queryTarget,"float_array_struct")
    ;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElement_4.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variableArrayStruct.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElement_3.m_state);
    pAVar4 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar4,parentStructure,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayStructMember.m_state,(Node *)pAVar4);
    pNVar2 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember
              ((StructMember *)pNVar2,(SharedPtr *)&arrayStructMember.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variableArrayStruct_1.m_state,pNVar2);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable
              (pVVar3,(SharedPtr *)&variableArrayStruct_1.m_state,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElement_5.m_state,(Node *)pVVar3);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)&arrayElement_5.m_state,queryTarget,"float_struct_array")
    ;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElement_5.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variableArrayStruct_1.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayStructMember.m_state);
    pAVar4 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar4,parentStructure,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&subArrayElement.m_state,(Node *)pAVar4);
    pAVar4 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar4,(SharedPtr *)&subArrayElement.m_state,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variableArrayStruct_2.m_state,(Node *)pAVar4);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable
              (pVVar3,(SharedPtr *)&variableArrayStruct_2.m_state,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&structMember_3.m_state,(Node *)pVVar3);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)&structMember_3.m_state,queryTarget,"float_array_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&structMember_3.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variableArrayStruct_2.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&subArrayElement.m_state);
    pNVar2 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar2,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&subStructMember.m_state,pNVar2);
    pNVar2 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember
              ((StructMember *)pNVar2,(SharedPtr *)&subStructMember.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variableArrayStruct_3.m_state,pNVar2);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable
              (pVVar3,(SharedPtr *)&variableArrayStruct_3.m_state,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElement_6.m_state,(Node *)pVVar3);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)&arrayElement_6.m_state,queryTarget,"float_struct_struct"
              );
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElement_6.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variableArrayStruct_3.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&subStructMember.m_state);
    if (queryTarget->interface == PROGRAMINTERFACE_BUFFER_VARIABLE) {
      pAVar4 = (ArrayElement *)operator_new(0x28);
      ResourceDefinition::ArrayElement::ArrayElement(pAVar4,parentStructure,-2);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&variableArray_3.m_state,(Node *)pAVar4);
      pVVar3 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable
                (pVVar3,(SharedPtr *)&variableArray_3.m_state,TYPE_FLOAT);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&structMember_4.m_state,(Node *)pVVar3);
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ResourceTestCase::ResourceTestCase
                (pRVar5,context,(SharedPtr *)&structMember_4.m_state,queryTarget,
                 "float_unsized_array");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)&structMember_4.m_state);
      pNVar2 = (Node *)operator_new(0x20);
      ResourceDefinition::StructMember::StructMember
                ((StructMember *)pNVar2,(SharedPtr *)&variableArray_3.m_state);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&variableArray_4.m_state,pNVar2);
      pVVar3 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable
                (pVVar3,(SharedPtr *)&variableArray_4.m_state,TYPE_FLOAT);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)local_260,(Node *)pVVar3);
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ResourceTestCase::ResourceTestCase
                (pRVar5,context,(SharedPtr *)local_260,queryTarget,"float_unsized_struct_array");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)local_260);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)&variableArray_4.m_state);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)&variableArray_3.m_state);
    }
  }
  return;
}

Assistant:

static void generateBufferReferencedByShaderInterfaceBlockCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const ProgramResourceQueryTestTarget& queryTarget, bool extendedCases)
{
	const bool isDefaultBlock = (parentStructure->getType() != ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);

	// .float
	// .float_array
	// .float_struct
	{
		const ResourceDefinition::Node::SharedPtr	variable		(new ResourceDefinition::Variable(parentStructure, glu::TYPE_FLOAT));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(parentStructure));
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));
		const ResourceDefinition::Node::SharedPtr	variableStruct	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));

		targetGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "float"));
		targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "float_array"));
		targetGroup->addChild(new ResourceTestCase(context, variableStruct, queryTarget, "float_struct"));
	}

	// .sampler
	// .sampler_array
	// .sampler_struct
	if (isDefaultBlock)
	{
		const ResourceDefinition::Node::SharedPtr	layout			(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, 0)));
		const ResourceDefinition::Node::SharedPtr	variable		(new ResourceDefinition::Variable(layout, glu::TYPE_SAMPLER_2D));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(layout));
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_SAMPLER_2D));
		const ResourceDefinition::Node::SharedPtr	variableStruct	(new ResourceDefinition::Variable(structMember, glu::TYPE_SAMPLER_2D));

		targetGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "sampler"));
		targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "sampler_array"));
		targetGroup->addChild(new ResourceTestCase(context, variableStruct, queryTarget, "sampler_struct"));
	}

	// .atomic_uint
	// .atomic_uint_array
	if (isDefaultBlock)
	{
		const ResourceDefinition::Node::SharedPtr	layout			(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, 0)));
		const ResourceDefinition::Node::SharedPtr	variable		(new ResourceDefinition::Variable(layout, glu::TYPE_UINT_ATOMIC_COUNTER));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(layout));
		const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));

		targetGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "atomic_uint"));
		targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "atomic_uint_array"));
	}

	if (extendedCases)
	{
		// .float_array_struct
		{
			const ResourceDefinition::Node::SharedPtr	structMember		(new ResourceDefinition::StructMember(parentStructure));
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(structMember));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_array_struct"));
		}

		// .float_struct_array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
			const ResourceDefinition::Node::SharedPtr	arrayStructMember	(new ResourceDefinition::StructMember(arrayElement));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(arrayStructMember, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_struct_array"));
		}

		// .float_array_array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
			const ResourceDefinition::Node::SharedPtr	subArrayElement		(new ResourceDefinition::ArrayElement(arrayElement));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(subArrayElement, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_array_array"));
		}

		// .float_struct_struct
		{
			const ResourceDefinition::Node::SharedPtr	structMember		(new ResourceDefinition::StructMember(parentStructure));
			const ResourceDefinition::Node::SharedPtr	subStructMember		(new ResourceDefinition::StructMember(structMember));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(subStructMember, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_struct_struct"));
		}

		if (queryTarget.interface == PROGRAMINTERFACE_BUFFER_VARIABLE)
		{
			const ResourceDefinition::Node::SharedPtr arrayElement(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));

			// .float_unsized_array
			{
				const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

				targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "float_unsized_array"));
			}

			// .float_unsized_struct_array
			{
				const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(arrayElement));
				const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));

				targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "float_unsized_struct_array"));
			}
		}
	}
}